

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::HttpClient::WebSocketResponse> __thiscall
kj::anon_unknown_36::HttpClientAdapter::openWebSocket
          (HttpClientAdapter *this,StringPtr url,HttpHeaders *headers)

{
  StringPtr *pSVar1;
  long lVar2;
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  HttpHeaders *pHVar3;
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>_>,_kj::_::PromiseDisposer>
  OVar4;
  PromiseFulfiller<kj::HttpClient::WebSocketResponse> *pPVar5;
  ReducePromises<kj::Promise<void>_> RVar6;
  WebSocketResponseImpl *pWVar7;
  void *pvVar8;
  void *__child_stack;
  __fn *in_R8;
  __fn *__arg;
  PromiseBase this_00;
  StringPtr value;
  Promise<void> promise;
  PromiseBase local_170;
  Own<kj::HttpHeaders,_std::nullptr_t> headersCopy;
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>_>,_kj::_::PromiseDisposer>
  local_158;
  Own<kj::NullStream,_std::nullptr_t> in;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_140;
  PromiseBase local_138;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t> responder
  ;
  PromiseFulfillerPair<kj::HttpClient::WebSocketResponse> paf;
  PromiseFulfillerPair<kj::Promise<void>_> requestPaf;
  String urlCopy;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_d8;
  char *local_d0;
  char *pcStack_c8;
  undefined8 local_c0;
  char *local_b8;
  char *pcStack_b0;
  undefined8 local_a8;
  HttpHeaders local_a0;
  StringPtr url_local;
  
  url_local.content.ptr = (char *)url.content.size_;
  __arg = in_R8;
  local_138.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  url_local.content.size_ = (size_t)headers;
  str<kj::StringPtr&>(&urlCopy,(kj *)&url_local,(StringPtr *)url_local.content.ptr);
  HttpHeaders::clone(&local_a0,in_R8,__child_stack,(int)headers,__arg);
  heap<kj::HttpHeaders>((kj *)&headersCopy,&local_a0);
  HttpHeaders::~HttpHeaders(&local_a0);
  pHVar3 = headersCopy.ptr;
  value.content.size_ = 10;
  value.content.ptr = "websocket";
  requireValidHeaderValue(value);
  pSVar1 = (pHVar3->indexedHeaders).ptr;
  pSVar1[4].content.ptr = "websocket";
  pSVar1[4].content.size_ = 10;
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_b0 = "openWebSocket";
  local_a8 = 0x1000001a54;
  location_00.function = (char *)in.ptr;
  location_00.fileName = (char *)in.disposer;
  location_00._16_8_ = local_140.ptr;
  newPromiseAndFulfiller<kj::HttpClient::WebSocketResponse>(location_00);
  pWVar7 = (WebSocketResponseImpl *)operator_new(0x30);
  pPVar5 = paf.fulfiller.ptr;
  local_a0.table = (HttpHeaderTable *)paf.fulfiller.disposer;
  paf.fulfiller.ptr = (PromiseFulfiller<kj::HttpClient::WebSocketResponse> *)0x0;
  (pWVar7->super_Response)._vptr_Response = (_func_int **)&PTR_send_00593a40;
  (pWVar7->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_00593a70
  ;
  (pWVar7->fulfiller).disposer = paf.fulfiller.disposer;
  local_a0.indexedHeaders.ptr = (StringPtr *)0x0;
  (pWVar7->fulfiller).ptr = pPVar5;
  (pWVar7->task).super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  (pWVar7->super_Refcounted).refcount = 1;
  responder.disposer = &(pWVar7->super_Refcounted).super_Disposer;
  responder.ptr = pWVar7;
  Own<kj::PromiseFulfiller<kj::HttpClient::WebSocketResponse>,_std::nullptr_t>::dispose
            ((Own<kj::PromiseFulfiller<kj::HttpClient::WebSocketResponse>,_std::nullptr_t> *)
             &local_a0);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_c8 = "openWebSocket";
  local_c0 = 0x1700001a57;
  location_01.function = (char *)local_138.node.ptr;
  location_01.fileName = (char *)local_140.ptr;
  location_01._16_8_ = responder.disposer;
  newPromiseAndFulfiller<kj::Promise<void>>(location_01);
  RVar6 = requestPaf.promise;
  local_170.node.ptr = (OwnPromiseNode)(OwnPromiseNode)requestPaf.promise.super_PromiseBase.node.ptr
  ;
  requestPaf.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  local_a0.table = (HttpHeaderTable *)0x43b3c6;
  local_a0.indexedHeaders.ptr = (StringPtr *)0x43ee6b;
  local_a0.indexedHeaders.size_ = 0xe00001b75;
  lVar2 = *(long *)((long)RVar6.super_PromiseBase.node.ptr + 8);
  if (lVar2 == 0 || (ulong)((long)RVar6.super_PromiseBase.node.ptr - lVar2) < 0x30) {
    pvVar8 = operator_new(0x400);
    this_00.node.ptr = (OwnPromiseNode)((long)pvVar8 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_00.node.ptr,&local_170.node,
               kj::_::IdentityFunc<void>::operator());
    *(undefined ***)((long)pvVar8 + 0x3d0) = &PTR_destroy_00593ce8;
    *(WebSocketResponseImpl **)((long)pvVar8 + 0x3f8) = pWVar7;
    *(void **)((long)pvVar8 + 0x3d8) = pvVar8;
  }
  else {
    *(undefined8 *)((long)RVar6.super_PromiseBase.node.ptr + 8) = 0;
    this_00.node.ptr = (OwnPromiseNode)((long)RVar6.super_PromiseBase.node.ptr + -0x30);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_00.node.ptr,&local_170.node,
               kj::_::IdentityFunc<void>::operator());
    *(undefined ***)((long)RVar6.super_PromiseBase.node.ptr + -0x30) = &PTR_destroy_00593ce8;
    *(WebSocketResponseImpl **)((long)RVar6.super_PromiseBase.node.ptr + -8) = pWVar7;
    *(long *)((long)RVar6.super_PromiseBase.node.ptr + -0x28) = lVar2;
  }
  in.disposer = (Disposer *)0x0;
  local_d8.ptr = (PromiseNode *)0x0;
  promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this_00.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_d8);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&in);
  location.function = (char *)local_a0.indexedHeaders.ptr;
  location.fileName = (char *)local_a0.table;
  location.lineNumber = (undefined4)local_a0.indexedHeaders.size_;
  location.columnNumber = local_a0.indexedHeaders.size_._4_4_;
  kj::_::spark<kj::_::Void>((OwnPromiseNode *)&local_158,location);
  local_140.ptr = (PromiseNode *)local_158.ptr;
  local_158.ptr =
       (AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>_>
        *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_158);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&pWVar7->task,&local_140);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_140);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_170.node);
  heap<kj::NullStream>();
  if (urlCopy.content.size_ == 0) {
    urlCopy.content.ptr = "";
  }
  (**(code **)**(undefined8 **)(url.content.ptr + 8))
            (&local_a0,*(undefined8 **)(url.content.ptr + 8),0,urlCopy.content.ptr,
             urlCopy.content.size_ + (urlCopy.content.size_ == 0),headersCopy.ptr,in.ptr,pWVar7);
  Promise<void>::
  attach<kj::Own<kj::NullStream,decltype(nullptr)>,kj::String,kj::Own<kj::HttpHeaders,decltype(nullptr)>>
            (&promise,(Own<kj::NullStream,_std::nullptr_t> *)&local_a0,(String *)&in,
             (Own<kj::HttpHeaders,_std::nullptr_t> *)&urlCopy);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_a0);
  (*((requestPaf.fulfiller.ptr)->super_PromiseRejector)._vptr_PromiseRejector[2])
            (requestPaf.fulfiller.ptr,&promise);
  responder.ptr = (WebSocketResponseImpl *)0x0;
  local_a0.table = (HttpHeaderTable *)&pWVar7->super_Refcounted;
  local_a0.indexedHeaders.ptr = (StringPtr *)pWVar7;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,decltype(nullptr)>>,kj::_::PromiseDisposer,kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,decltype(nullptr)>>
            ((PromiseDisposer *)&local_158,(OwnPromiseNode *)&paf,
             (Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>
              *)&local_a0);
  OVar4.ptr = local_158.ptr;
  local_158.ptr =
       (AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>_>
        *)0x0;
  ((PromiseArenaMember *)local_138.node.ptr)->_vptr_PromiseArenaMember = (_func_int **)OVar4.ptr;
  local_d8.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_d8);
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>_>,_kj::_::PromiseDisposer>
  ::~Own(&local_158);
  Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>
              *)&local_a0);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
  Own<kj::NullStream,_std::nullptr_t>::dispose(&in);
  PromiseFulfillerPair<kj::Promise<void>_>::~PromiseFulfillerPair(&requestPaf);
  Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>::~Own
            (&responder);
  PromiseFulfillerPair<kj::HttpClient::WebSocketResponse>::~PromiseFulfillerPair(&paf);
  if (headersCopy.ptr != (HttpHeaders *)0x0) {
    headersCopy.ptr = (HttpHeaders *)0x0;
    (**(headersCopy.disposer)->_vptr_Disposer)();
  }
  Array<char>::~Array(&urlCopy.content);
  return (Promise<kj::HttpClient::WebSocketResponse>)(PromiseNode *)local_138.node.ptr;
}

Assistant:

kj::Promise<WebSocketResponse> openWebSocket(
      kj::StringPtr url, const HttpHeaders& headers) override {
    // We have to clone the URL and headers because HttpService implementation are allowed to
    // assume that they remain valid until the service handler completes whereas HttpClient callers
    // are allowed to destroy them immediately after the call. Also we need to add
    // `Upgrade: websocket` so that headers.isWebSocket() returns true on the service side.
    auto urlCopy = kj::str(url);
    auto headersCopy = kj::heap(headers.clone());
    headersCopy->set(HttpHeaderId::UPGRADE, "websocket");
    KJ_DASSERT(headersCopy->isWebSocket());

    auto paf = kj::newPromiseAndFulfiller<WebSocketResponse>();
    auto responder = kj::refcounted<WebSocketResponseImpl>(kj::mv(paf.fulfiller));

    auto requestPaf = kj::newPromiseAndFulfiller<kj::Promise<void>>();
    responder->setPromise(kj::mv(requestPaf.promise));

    auto in = kj::heap<kj::NullStream>();
    auto promise = service.request(HttpMethod::GET, urlCopy, *headersCopy, *in, *responder)
        .attach(kj::mv(in), kj::mv(urlCopy), kj::mv(headersCopy));
    requestPaf.fulfiller->fulfill(kj::mv(promise));

    return paf.promise.attach(kj::mv(responder));
  }